

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  int iVar4;
  uchar *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  _7z_folder *p_Var8;
  _7z_coder *p_Var9;
  byte *pbVar10;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar11;
  uint64_t *puVar12;
  uint32_t *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  unsigned_long id;
  uint64_t uVar17;
  uint i;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  ulong uVar22;
  uchar uVar23;
  ulong uVar24;
  bool bVar25;
  ulong local_70;
  _7z_digests local_58;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) {
    return -1;
  }
  uVar23 = *puVar5;
  if (uVar23 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar4 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar4 < 0) {
      return -1;
    }
    puVar12 = &(si->pi).numPackStreams;
    iVar4 = parse_7zip_uint64(a,puVar12);
    if (iVar4 < 0) {
      return -1;
    }
    if (*puVar12 - 0x5f5e101 < 0xfffffffffa0a1f00) {
      return -1;
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar5 != '\0') {
      if (*puVar5 != '\t') {
        return -1;
      }
      sVar21 = (si->pi).numPackStreams;
      puVar6 = (uint64_t *)calloc(sVar21,8);
      (si->pi).sizes = puVar6;
      puVar7 = (uint64_t *)calloc(sVar21,8);
      (si->pi).positions = puVar7;
      if (puVar7 == (uint64_t *)0x0 || puVar6 == (uint64_t *)0x0) {
        return -1;
      }
      uVar15 = 0;
      while ((ulong)uVar15 < *puVar12) {
        iVar4 = parse_7zip_uint64(a,(si->pi).sizes + uVar15);
        uVar15 = uVar15 + 1;
        if (iVar4 < 0) {
          return -1;
        }
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        sVar21 = (si->pi).numPackStreams;
        puVar5 = (uchar *)calloc(sVar21,1);
        (si->pi).digest.defineds = puVar5;
        puVar13 = (uint32_t *)calloc(sVar21,4);
        (si->pi).digest.digests = puVar13;
        if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar5 != '\t') {
          return -1;
        }
        iVar4 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar4 < 0) {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar5 != '\0') {
          return -1;
        }
      }
    }
    puVar6 = (si->pi).positions;
    if (puVar6 == (uint64_t *)0x0) {
      return -1;
    }
    puVar7 = (si->pi).sizes;
    if (puVar7 == (uint64_t *)0x0) {
      return -1;
    }
    uVar18 = (si->pi).pos;
    uVar15 = 0;
    while (uVar22 = (ulong)uVar15, uVar22 < *puVar12) {
      puVar6[uVar22] = uVar18;
      uVar18 = uVar18 + puVar7[uVar22];
      uVar15 = uVar15 + 1;
      if (*(ulong *)((long)pvVar2 + 0x80) < uVar18) {
        return -1;
      }
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    uVar23 = *puVar5;
  }
  if (uVar23 != '\a') goto LAB_004514a1;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_58.defineds = (uchar *)0x0;
  local_58.digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\v')) goto LAB_0045131e;
  val = &si->ci;
  iVar4 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar4 < 0) goto LAB_0045131e;
  if (100000000 < val->numFolders) {
    return -1;
  }
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) goto LAB_0045131e;
  if (*puVar5 == '\x01') {
    puVar12 = &(si->ci).dataStreamIndex;
    iVar4 = parse_7zip_uint64(a,puVar12);
    if (iVar4 < 0) {
      return -1;
    }
    if (100000000 < *puVar12) {
      return -1;
    }
    if (val->numFolders != 0) goto LAB_00451309;
  }
  else {
    if (*puVar5 != '\0') {
LAB_00451309:
      archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
      goto LAB_0045131e;
    }
    sVar21 = (si->ci).numFolders;
    p_Var8 = (_7z_folder *)calloc(sVar21,0x68);
    (si->ci).folders = p_Var8;
    if (p_Var8 == (_7z_folder *)0x0) {
      return -1;
    }
    uVar15 = 0;
    while (uVar18 = (ulong)uVar15, uVar18 < sVar21) {
      p_Var3 = (si->ci).folders;
      p_Var8 = p_Var3 + uVar18;
      local_38 = a->format->data;
      p_Var3[uVar18].numUnpackStreams = 0;
      (&p_Var3[uVar18].numUnpackStreams)[1] = 0;
      p_Var3[uVar18].unPackSize = (uint64_t *)0x0;
      (&p_Var3[uVar18].unPackSize)[1] = (uint64_t *)0x0;
      p_Var3[uVar18].numInStreams = 0;
      (&p_Var3[uVar18].numInStreams)[1] = 0;
      p_Var3[uVar18].numPackedStreams = 0;
      (&p_Var3[uVar18].numPackedStreams)[1] = 0;
      p_Var3[uVar18].numBindPairs = 0;
      (&p_Var3[uVar18].numBindPairs)[1] = 0;
      p_Var3[uVar18].numCoders = 0;
      p_Var3[uVar18].coders = (_7z_coder *)0x0;
      p_Var3[uVar18].skipped_bytes = 0;
      local_40 = uVar18;
      iVar4 = parse_7zip_uint64(a,&p_Var8->numCoders);
      if ((iVar4 < 0) || (uVar18 = p_Var8->numCoders, 4 < uVar18)) goto LAB_0045131e;
      p_Var9 = (_7z_coder *)calloc(uVar18,0x28);
      p_Var8->coders = p_Var9;
      if (p_Var9 == (_7z_coder *)0x0) goto LAB_0045131e;
      uVar17 = 0;
      local_70 = 0;
      for (uVar15 = 0; uVar22 = (ulong)uVar15, uVar22 < uVar18; uVar15 = uVar15 + 1) {
        pbVar10 = header_bytes(a,1);
        if ((pbVar10 == (byte *)0x0) || (bVar1 = *pbVar10, (char)bVar1 < '\0')) goto LAB_0045131e;
        puVar5 = header_bytes(a,(ulong)(bVar1 & 0xf));
        if (puVar5 == (uchar *)0x0) goto LAB_0045131e;
        uVar18 = 0;
        for (uVar19 = 0; (bVar1 & 0xf) != uVar19; uVar19 = uVar19 + 1) {
          uVar18 = uVar18 << 8 | (ulong)puVar5[uVar19];
        }
        p_Var9 = p_Var8->coders;
        puVar12 = &p_Var9[uVar22].numInStreams;
        p_Var9[uVar22].codec = uVar18;
        if ((bVar1 & 0x10) == 0) {
          *puVar12 = 1;
          p_Var9[uVar22].numOutStreams = 1;
        }
        else {
          iVar4 = parse_7zip_uint64(a,puVar12);
          if ((((iVar4 < 0) || (100000000 < p_Var8->coders[uVar22].numInStreams)) ||
              (iVar4 = parse_7zip_uint64(a,&p_Var8->coders[uVar22].numOutStreams), iVar4 < 0)) ||
             (p_Var9 = p_Var8->coders, 100000000 < p_Var9[uVar22].numOutStreams)) goto LAB_0045131e;
        }
        if ((bVar1 & 0x20) != 0) {
          iVar4 = parse_7zip_uint64(a,&p_Var9[uVar22].propertiesSize);
          if ((iVar4 < 0) ||
             (puVar5 = header_bytes(a,p_Var8->coders[uVar22].propertiesSize), puVar5 == (uchar *)0x0
             )) goto LAB_0045131e;
          p_Var9 = p_Var8->coders;
          sVar21 = p_Var9[uVar22].propertiesSize;
          __dest = (uchar *)malloc(sVar21);
          p_Var9[uVar22].properties = __dest;
          if (__dest == (uchar *)0x0) goto LAB_0045131e;
          memcpy(__dest,puVar5,sVar21);
        }
        local_70 = local_70 + p_Var9[uVar22].numInStreams;
        uVar17 = uVar17 + p_Var9[uVar22].numOutStreams;
        uVar18 = p_Var8->numCoders;
      }
      if (((uVar17 == 0) || (sVar21 = uVar17 - 1, local_70 < sVar21)) ||
         (p_Var8->numBindPairs = sVar21, *(ulong *)((long)local_38 + 0x70) < sVar21))
      goto LAB_0045131e;
      if (sVar21 == 0) {
        p_Var8->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
        paVar11 = (anon_struct_16_2_4d417c8e *)0x0;
      }
      else {
        paVar11 = (anon_struct_16_2_4d417c8e *)calloc(sVar21,0x10);
        p_Var8->bindPairs = paVar11;
        if (paVar11 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_0045131e;
      }
      uVar15 = 0;
      while( true ) {
        uVar22 = (ulong)uVar15;
        uVar18 = p_Var8->numBindPairs;
        if (uVar18 <= uVar22) break;
        iVar4 = parse_7zip_uint64(a,&paVar11[uVar22].inIndex);
        if (((iVar4 < 0) || (100000000 < p_Var8->bindPairs[uVar22].inIndex)) ||
           (iVar4 = parse_7zip_uint64(a,&p_Var8->bindPairs[uVar22].outIndex), iVar4 < 0))
        goto LAB_0045131e;
        paVar11 = p_Var8->bindPairs;
        uVar15 = uVar15 + 1;
        if (100000000 < paVar11[uVar22].outIndex) goto LAB_0045131e;
      }
      sVar21 = local_70 - uVar18;
      p_Var8->numPackedStreams = sVar21;
      puVar12 = (uint64_t *)calloc(sVar21,8);
      p_Var8->packedStreams = puVar12;
      if (puVar12 == (uint64_t *)0x0) goto LAB_0045131e;
      if (sVar21 == 1) {
        uVar22 = 0;
        do {
          uVar19 = uVar22;
          if (local_70 <= uVar19) break;
          uVar22 = 0;
          do {
            uVar14 = uVar22;
            if (uVar18 <= uVar14) break;
            uVar22 = (ulong)((int)uVar14 + 1);
          } while (paVar11[uVar14].inIndex != uVar19);
          uVar22 = (ulong)((int)uVar19 + 1);
        } while (uVar18 != uVar14);
        if (local_70 == uVar19) goto LAB_0045131e;
        *puVar12 = uVar19;
      }
      else {
        uVar15 = 0;
        while (uVar18 = (ulong)uVar15, uVar18 < p_Var8->numPackedStreams) {
          iVar4 = parse_7zip_uint64(a,puVar12 + uVar18);
          if (iVar4 < 0) goto LAB_0045131e;
          puVar12 = p_Var8->packedStreams;
          uVar15 = uVar15 + 1;
          if (100000000 < puVar12[uVar18]) goto LAB_0045131e;
        }
      }
      p_Var8->numInStreams = local_70;
      p_Var8->numOutStreams = uVar17;
      sVar21 = val->numFolders;
      uVar15 = (int)local_40 + 1;
    }
  }
  puVar5 = header_bytes(a,1);
  if ((puVar5 != (uchar *)0x0) && (*puVar5 == '\f')) {
    for (uVar15 = 0; uVar18 = (ulong)uVar15, uVar18 < val->numFolders; uVar15 = uVar15 + 1) {
      p_Var8 = (si->ci).folders;
      puVar12 = (uint64_t *)calloc(p_Var8[uVar18].numOutStreams,8);
      p_Var8[uVar18].unPackSize = puVar12;
      if (puVar12 == (uint64_t *)0x0) goto LAB_0045131e;
      uVar22 = 0;
      while (uVar22 < p_Var8[uVar18].numOutStreams) {
        iVar4 = parse_7zip_uint64(a,p_Var8[uVar18].unPackSize + uVar22);
        uVar22 = (ulong)((int)uVar22 + 1);
        if (iVar4 < 0) goto LAB_0045131e;
      }
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 != (uchar *)0x0) {
      if (*puVar5 == '\n') {
        iVar4 = read_Digests(a,&local_58,val->numFolders);
        if (iVar4 < 0) goto LAB_0045131e;
        uVar18 = val->numFolders;
        for (uVar15 = 0; uVar22 = (ulong)uVar15, uVar22 < uVar18; uVar15 = uVar15 + 1) {
          p_Var8 = (si->ci).folders;
          p_Var8[uVar22].digest_defined = local_58.defineds[uVar22];
          p_Var8[uVar22].digest = local_58.digests[uVar22];
        }
        puVar5 = header_bytes(a,1);
        if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\0')) goto LAB_0045131e;
        free_Digest(&local_58);
      }
      else if (*puVar5 != '\0') goto LAB_0045131e;
      uVar18 = (si->ci).numFolders;
      p_Var8 = (si->ci).folders;
      uVar15 = 0;
      uVar22 = 0;
      while (uVar19 = (ulong)uVar15, uVar19 < uVar18) {
        p_Var8[uVar19].packIndex = (uint32_t)uVar22;
        uVar22 = (ulong)((uint32_t)uVar22 + (int)p_Var8[uVar19].numPackedStreams);
        uVar15 = uVar15 + 1;
        if ((si->pi).numPackStreams < uVar22) {
          return -1;
        }
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      uVar23 = *puVar5;
LAB_004514a1:
      if (uVar23 == '\b') {
        uVar18 = (si->ci).numFolders;
        p_Var8 = (si->ci).folders;
        (si->ss).unpack_streams = 0;
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ss).digests = (uint32_t *)0x0;
        for (uVar15 = 0; uVar15 < uVar18; uVar15 = uVar15 + 1) {
          p_Var8[uVar15].numUnpackStreams = 1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar23 = *puVar5;
        uVar22 = uVar18;
        if (uVar23 == '\r') {
          puVar12 = &p_Var8->numUnpackStreams;
          uVar22 = 0;
          uVar19 = uVar18;
          while (bVar25 = uVar19 != 0, uVar19 = uVar19 - 1, bVar25) {
            iVar4 = parse_7zip_uint64(a,puVar12);
            if (iVar4 < 0) {
              return -1;
            }
            if (100000000 < *puVar12) {
              return -1;
            }
            uVar22 = uVar22 + *puVar12;
            puVar12 = puVar12 + 0xd;
          }
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar23 = *puVar5;
        }
        (si->ss).unpack_streams = uVar22;
        if (uVar22 == 0) {
          puVar12 = (si->ss).unpackSizes;
        }
        else {
          puVar12 = (uint64_t *)calloc(uVar22,8);
          (si->ss).unpackSizes = puVar12;
          puVar5 = (uchar *)calloc(uVar22,1);
          (si->ss).digestsDefined = puVar5;
          puVar13 = (uint32_t *)calloc(uVar22,4);
          (si->ss).digests = puVar13;
          if (puVar12 == (uint64_t *)0x0) {
            return -1;
          }
          if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
            return -1;
          }
        }
        for (uVar15 = 0; uVar19 = (ulong)uVar15, uVar19 < uVar18; uVar15 = uVar15 + 1) {
          uVar14 = p_Var8[uVar19].numUnpackStreams;
          if (uVar14 != 0) {
            if (uVar23 == '\t') {
              lVar20 = 0;
              for (uVar24 = 1; uVar24 < uVar14; uVar24 = (ulong)((int)uVar24 + 1)) {
                iVar4 = parse_7zip_uint64(a,puVar12);
                if (iVar4 < 0) {
                  return -1;
                }
                lVar20 = lVar20 + *puVar12;
                puVar12 = puVar12 + 1;
                uVar14 = p_Var8[uVar19].numUnpackStreams;
              }
            }
            else {
              lVar20 = 0;
            }
            uVar17 = folder_uncompressed_size(p_Var8 + uVar19);
            *puVar12 = uVar17 - lVar20;
            puVar12 = puVar12 + 1;
          }
        }
        if (uVar23 == '\t') {
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar23 = *puVar5;
        }
        for (uVar15 = 0; uVar19 = (ulong)uVar15, uVar19 < uVar22; uVar15 = uVar15 + 1) {
          (si->ss).digestsDefined[uVar19] = '\0';
          (si->ss).digests[uVar19] = 0;
        }
        uVar15 = 0;
        for (uVar16 = 0; uVar22 = (ulong)uVar16, uVar22 < uVar18; uVar16 = uVar16 + 1) {
          if ((p_Var8[uVar22].numUnpackStreams != 1) || (p_Var8[uVar22].digest_defined == '\0')) {
            uVar15 = uVar15 + (int)p_Var8[uVar22].numUnpackStreams;
          }
        }
        if (uVar23 == '\n') {
          puVar5 = (si->ss).digestsDefined;
          puVar13 = (si->ss).digests;
          local_58.defineds = (uchar *)0x0;
          local_58.digests = (uint32_t *)0x0;
          iVar4 = read_Digests(a,&local_58,(ulong)uVar15);
          if (iVar4 < 0) {
            free_Digest(&local_58);
            return -1;
          }
          iVar4 = 0;
          for (uVar22 = 0; uVar22 != uVar18; uVar22 = uVar22 + 1) {
            uVar17 = p_Var8[uVar22].numUnpackStreams;
            if ((uVar17 == 1) && (p_Var8[uVar22].digest_defined != '\0')) {
              *puVar5 = '\x01';
              puVar5 = puVar5 + 1;
              *puVar13 = p_Var8[uVar22].digest;
              puVar13 = puVar13 + 1;
            }
            else {
              lVar20 = (long)iVar4;
              for (uVar15 = 0; uVar15 < uVar17; uVar15 = uVar15 + 1) {
                *puVar5 = local_58.defineds[lVar20];
                puVar5 = puVar5 + 1;
                *puVar13 = local_58.digests[lVar20];
                puVar13 = puVar13 + 1;
                lVar20 = lVar20 + 1;
                uVar17 = p_Var8[uVar22].numUnpackStreams;
              }
              iVar4 = iVar4 + uVar15;
            }
          }
          free_Digest(&local_58);
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar23 = *puVar5;
        }
        if (uVar23 != '\0') {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar23 = *puVar5;
      }
      return -(uint)(uVar23 != '\0');
    }
  }
LAB_0045131e:
  free_Digest(&local_58);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}